

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

err_t UnCompressFrameZLib(uint8_t *Cursor,size_t CursorSize,array *OutBuf,size_t *FrameSize,
                         size_t *ArrayOffset)

{
  int iVar1;
  uint uVar2;
  bool_t bVar3;
  err_t eVar4;
  long lVar5;
  z_stream stream;
  
  stream.adler = 0;
  stream.reserved = 0;
  stream.opaque = (voidpf)0x0;
  stream.data_type = 0;
  stream._92_4_ = 0;
  stream.zalloc = (alloc_func)0x0;
  stream.zfree = (free_func)0x0;
  stream.msg = (char *)0x0;
  stream.state = (internal_state *)0x0;
  stream.avail_out = 0;
  stream._36_4_ = 0;
  stream.total_out = 0;
  stream.total_in = 0;
  stream.next_out = (Bytef *)0x0;
  stream.next_in = (Bytef *)0x0;
  stream.avail_in = 0;
  stream._12_4_ = 0;
  iVar1 = inflateInit_(&stream,"1.2.11",0x70);
  if (iVar1 == 0) {
    stream.avail_in = (uInt)CursorSize;
    stream.next_in = Cursor;
    if (OutBuf == (array *)0x0) {
      __assert_fail("&(*OutBuf)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0xa0,
                    "err_t UnCompressFrameZLib(const uint8_t *, size_t, array *, size_t *, size_t *)"
                   );
    }
    stream.next_out = (Bytef *)(OutBuf->_Begin + *ArrayOffset);
    while( true ) {
      lVar5 = (long)stream.next_out - (long)OutBuf->_Begin;
      bVar3 = ArrayResize(OutBuf,lVar5 + 0x400,0);
      if (bVar3 == 0) break;
      stream.avail_out = (int)OutBuf->_Used - (int)lVar5;
      stream.next_out = (Bytef *)(OutBuf->_Begin + lVar5);
      uVar2 = inflate(&stream,0);
      if ((((1 < uVar2) || (uVar2 == 1)) || (stream.avail_in == 0)) || (stream.avail_out != 0))
      goto LAB_00106248;
    }
    uVar2 = 0xfffffffc;
LAB_00106248:
    *FrameSize = stream.total_out;
    *ArrayOffset = *ArrayOffset + stream.total_out;
    inflateEnd();
    eVar4 = (ulong)(uVar2 == 1) * 3 + -3;
  }
  else {
    eVar4 = -3;
  }
  return eVar4;
}

Assistant:

err_t UnCompressFrameZLib(const uint8_t *Cursor, size_t CursorSize, array *OutBuf, size_t *FrameSize, size_t *ArrayOffset)
{
    z_stream stream;
    int Res;
    err_t Err = ERR_NONE;

    memset(&stream,0,sizeof(stream));
    Res = inflateInit(&stream);
    if (Res != Z_OK)
        Err = ERR_INVALID_DATA;
    else
    {
        size_t Count;
        stream.next_in = (Bytef*)Cursor;
        stream.avail_in = CursorSize;
        stream.next_out = ARRAYBEGIN(*OutBuf,uint8_t) + *ArrayOffset;
        do {
            Count = stream.next_out - ARRAYBEGIN(*OutBuf,uint8_t);
            if (!ArrayResize(OutBuf, Count + 1024, 0))
            {
                Res = Z_MEM_ERROR;
                break;
            }
            stream.avail_out = ARRAYCOUNT(*OutBuf,uint8_t) - Count;
            stream.next_out = ARRAYBEGIN(*OutBuf,uint8_t) + Count;
            Res = inflate(&stream, Z_NO_FLUSH);
            if (Res!=Z_STREAM_END && Res!=Z_OK)
                break;
        } while (Res!=Z_STREAM_END && stream.avail_in && !stream.avail_out);
        *FrameSize = stream.total_out;
        *ArrayOffset = *ArrayOffset + stream.total_out;
        inflateEnd(&stream);
        if (Res != Z_STREAM_END)
            Err = ERR_INVALID_DATA;
    }
    return Err;
}